

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::AggregationPS::execute
          (AggregationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  VarStatus *pVVar14;
  undefined8 *puVar15;
  VarStatus VVar16;
  long lVar17;
  bool bVar18;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  int32_t *piVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  cpp_dec_float<50U,_int,_void> *v_00;
  long lVar23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  undefined1 local_6c8 [48];
  undefined8 local_698;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_690;
  cpp_dec_float<50U,_int,_void> local_688;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_648;
  undefined8 uStack_640;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_630;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_628;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_620;
  cpp_dec_float<50U,_int,_void> local_618;
  cpp_dec_float<50U,_int,_void> local_5d8;
  cpp_dec_float<50U,_int,_void> local_598;
  uint local_558 [2];
  uint auStack_550 [2];
  uint local_548 [2];
  undefined8 uStack_540;
  undefined8 local_538;
  uint local_528 [2];
  uint auStack_520 [2];
  uint local_518 [2];
  uint auStack_510 [2];
  uint local_508 [4];
  fpclass_type local_4f8;
  int32_t iStack_4f4;
  undefined8 uStack_4f0;
  cpp_dec_float<50U,_int,_void> local_4e8;
  cpp_dec_float<50U,_int,_void> local_4b0;
  cpp_dec_float<50U,_int,_void> local_478;
  cpp_dec_float<50U,_int,_void> local_440;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar12 = this->m_i;
  iVar11 = this->m_old_i;
  if (iVar12 != iVar11) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar6 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar7 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar11].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar11].m_backend.data = uVar6;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = uVar7;
    pnVar5[iVar11].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar11].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar9 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar11].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar11].m_backend.prec_elem = iVar9;
    iVar12 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = this->m_old_i;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar6 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar7 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar11].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar11].m_backend.data = uVar6;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = uVar7;
    pnVar5[iVar11].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar11].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar9 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar11].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar11].m_backend.prec_elem = iVar9;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar12 = this->m_j;
  iVar11 = this->m_old_j;
  if (iVar12 != iVar11) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar6 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar7 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar11].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar11].m_backend.data = uVar6;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = uVar7;
    pnVar5[iVar11].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar11].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar9 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar11].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar11].m_backend.prec_elem = iVar9;
    iVar12 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = this->m_old_j;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    uVar6 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar11].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar6;
    *(undefined8 *)&pnVar5[iVar11].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar11].m_backend.exp = pnVar5[iVar12].m_backend.exp;
    pnVar5[iVar11].m_backend.neg = pnVar5[iVar12].m_backend.neg;
    iVar9 = pnVar5[iVar12].m_backend.prec_elem;
    pnVar5[iVar11].m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    pnVar5[iVar11].m_backend.prec_elem = iVar9;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_598.fpclass = cpp_dec_float_finite;
  local_598.prec_elem = 10;
  local_598.data._M_elems[0] = 0;
  local_598.data._M_elems[1] = 0;
  local_598.data._M_elems[2] = 0;
  local_598.data._M_elems[3] = 0;
  local_598.data._M_elems[4] = 0;
  local_598.data._M_elems[5] = 0;
  local_598.data._M_elems._24_5_ = 0;
  local_598.data._M_elems[7]._1_3_ = 0;
  local_598.data._M_elems._32_5_ = 0;
  local_598.data._M_elems[9]._1_3_ = 0;
  local_598.exp = 0;
  local_598.neg = false;
  local_648 = x;
  local_630 = s;
  local_628 = r;
  local_620 = y;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_598,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_440,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar12 = -1;
  lVar17 = 0;
  bVar10 = true;
  do {
    bVar18 = bVar10;
    pNVar13 = (this->m_row).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    iVar11 = pNVar13[lVar17].idx;
    if (iVar11 != this->m_j) {
      pNVar13 = pNVar13 + lVar17;
      pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((local_648->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar11);
      local_698._0_4_ = cpp_dec_float_finite;
      local_698._4_4_ = 10;
      local_6c8._0_4_ = 0;
      local_6c8._4_4_ = 0;
      local_6c8._8_4_ = 0;
      local_6c8._12_4_ = 0;
      local_6c8._16_4_ = 0;
      local_6c8._20_4_ = 0;
      local_6c8._24_5_ = 0;
      local_6c8._29_3_ = 0;
      local_6c8._32_5_ = 0;
      local_6c8._37_3_ = 0;
      local_6c8._40_4_ = 0;
      local_6c8[0x2c] = false;
      v = pNVar13;
      if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)local_6c8 != pNVar20) &&
         (v = pNVar20,
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)local_6c8 != pNVar13)) {
        uVar6 = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 8);
        local_6c8._32_5_ = (undefined5)uVar6;
        local_6c8._37_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_6c8._0_8_ = *(undefined8 *)(pNVar13->val).m_backend.data._M_elems;
        local_6c8._8_8_ = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 2);
        local_6c8._16_8_ = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 4);
        uVar6 = *(undefined8 *)((pNVar13->val).m_backend.data._M_elems + 6);
        local_6c8._24_5_ = (undefined5)uVar6;
        local_6c8._29_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_6c8._40_4_ = (pNVar13->val).m_backend.exp;
        local_6c8[0x2c] = (pNVar13->val).m_backend.neg;
        local_698._0_4_ = (pNVar13->val).m_backend.fpclass;
        local_698._4_4_ = (pNVar13->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)local_6c8,(cpp_dec_float<50U,_int,_void> *)v);
      local_598.data._M_elems[0] = local_6c8._0_4_;
      local_598.data._M_elems[1] = local_6c8._4_4_;
      local_598.data._M_elems[2] = local_6c8._8_4_;
      local_598.data._M_elems[3] = local_6c8._12_4_;
      local_598.data._M_elems[4] = local_6c8._16_4_;
      local_598.data._M_elems[5] = local_6c8._20_4_;
      local_598.data._M_elems._24_5_ = local_6c8._24_5_;
      local_598.data._M_elems[7]._1_3_ = local_6c8._29_3_;
      local_598.data._M_elems._32_5_ = local_6c8._32_5_;
      local_598.data._M_elems[9]._1_3_ = local_6c8._37_3_;
      local_598.exp = local_6c8._40_4_;
      local_598.neg = local_6c8[0x2c];
      local_598.fpclass = (fpclass_type)local_698;
      local_598.prec_elem = local_698._4_4_;
      iVar12 = iVar11;
    }
    lVar17 = 1;
    bVar10 = false;
  } while (bVar18);
  uVar6 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8);
  local_6c8._32_5_ = (undefined5)uVar6;
  local_6c8._37_3_ = (undefined3)((ulong)uVar6 >> 0x28);
  local_6c8._0_8_ = *(undefined8 *)(this->m_rhs).m_backend.data._M_elems;
  local_6c8._8_8_ = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2);
  local_6c8._16_8_ = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4);
  uVar6 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6);
  local_6c8._24_5_ = (undefined5)uVar6;
  local_6c8._29_3_ = (undefined3)((ulong)uVar6 >> 0x28);
  local_6c8._40_4_ = (this->m_rhs).m_backend.exp;
  local_6c8[0x2c] = (this->m_rhs).m_backend.neg;
  local_698._0_4_ = (this->m_rhs).m_backend.fpclass;
  local_698._4_4_ = (this->m_rhs).m_backend.prec_elem;
  if ((local_6c8[0x2c] == true) &&
     (local_6c8._0_4_ != 0 || (fpclass_type)local_698 != cpp_dec_float_finite)) {
    local_6c8[0x2c] = false;
  }
  uVar7._5_3_ = local_598.data._M_elems[9]._1_3_;
  uVar7._0_5_ = local_598.data._M_elems._32_5_;
  local_618.data._M_elems[8] = local_598.data._M_elems[8];
  local_618.data._M_elems[9] = SUB84(uVar7,4);
  uVar6._5_3_ = local_598.data._M_elems[7]._1_3_;
  uVar6._0_5_ = local_598.data._M_elems._24_5_;
  local_618.data._M_elems[4] = local_598.data._M_elems[4];
  local_618.data._M_elems[5] = local_598.data._M_elems[5];
  local_618.data._M_elems[6] = local_598.data._M_elems[6];
  local_618.data._M_elems[7] = SUB84(uVar6,4);
  local_618.data._M_elems[0] = local_598.data._M_elems[0];
  local_618.data._M_elems[1] = local_598.data._M_elems[1];
  uVar6 = local_618.data._M_elems._0_8_;
  local_618.data._M_elems[2] = local_598.data._M_elems[2];
  local_618.data._M_elems[3] = local_598.data._M_elems[3];
  local_618.exp = local_598.exp;
  local_618.neg = local_598.neg;
  local_618.fpclass = local_598.fpclass;
  local_618.prec_elem = local_598.prec_elem;
  local_5d8.fpclass = local_598.fpclass;
  if ((local_598.neg != false) &&
     (local_618.data._M_elems[0] = local_598.data._M_elems[0],
     local_5d8.fpclass != cpp_dec_float_finite || local_618.data._M_elems[0] != 0)) {
    local_618.neg = (bool)(local_598.neg ^ 1);
  }
  local_618.data._M_elems._0_8_ = uVar6;
  if (local_5d8.fpclass == cpp_dec_float_NaN || (fpclass_type)local_698 == cpp_dec_float_NaN) {
LAB_002fbddb:
    piVar21 = &local_618.prec_elem;
    local_5d8.data._M_elems[8] = local_618.data._M_elems[8];
    local_5d8.data._M_elems[9] = local_618.data._M_elems[9];
    local_5d8.data._M_elems[4] = local_618.data._M_elems[4];
    local_5d8.data._M_elems[5] = local_618.data._M_elems[5];
    local_5d8.data._M_elems[6] = local_618.data._M_elems[6];
    local_5d8.data._M_elems[7] = local_618.data._M_elems[7];
    local_5d8.data._M_elems[0] = local_618.data._M_elems[0];
    local_5d8.data._M_elems[1] = local_618.data._M_elems[1];
    local_5d8.data._M_elems[2] = local_618.data._M_elems[2];
    local_5d8.data._M_elems[3] = local_618.data._M_elems[3];
    local_5d8.exp = local_618.exp;
    local_5d8.neg = local_618.neg;
  }
  else {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       ((cpp_dec_float<50U,_int,_void> *)local_6c8,&local_618);
    if (iVar11 < 1) {
      local_5d8.fpclass = local_618.fpclass;
      goto LAB_002fbddb;
    }
    piVar21 = (int32_t *)((long)&local_698 + 4);
    local_5d8.data._M_elems[9]._1_3_ = local_6c8._37_3_;
    local_5d8.data._M_elems._32_5_ = local_6c8._32_5_;
    local_5d8.data._M_elems[7]._1_3_ = local_6c8._29_3_;
    local_5d8.data._M_elems._24_5_ = local_6c8._24_5_;
    local_5d8.data._M_elems[4] = local_6c8._16_4_;
    local_5d8.data._M_elems[5] = local_6c8._20_4_;
    local_5d8.data._M_elems[0] = local_6c8._0_4_;
    local_5d8.data._M_elems[1] = local_6c8._4_4_;
    local_5d8.data._M_elems[2] = local_6c8._8_4_;
    local_5d8.data._M_elems[3] = local_6c8._12_4_;
    local_5d8.exp = local_6c8._40_4_;
    local_5d8.neg = local_6c8[0x2c];
    local_5d8.fpclass = (fpclass_type)local_698;
  }
  local_5d8.prec_elem = *piVar21;
  if (local_5d8.fpclass != cpp_dec_float_NaN) {
    local_698._0_4_ = cpp_dec_float_finite;
    local_698._4_4_ = 10;
    local_6c8._0_4_ = 0;
    local_6c8._4_4_ = 0;
    local_6c8._8_4_ = 0;
    local_6c8._12_4_ = 0;
    local_6c8._16_4_ = 0;
    local_6c8._20_4_ = 0;
    local_6c8._24_5_ = 0;
    local_6c8._29_3_ = 0;
    local_6c8._32_5_ = 0;
    local_6c8._37_3_ = 0;
    local_6c8._40_4_ = 0;
    local_6c8[0x2c] = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_6c8,1.0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_5d8,(cpp_dec_float<50U,_int,_void> *)local_6c8);
    if (iVar11 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_5d8,1.0);
    }
  }
  local_698._0_4_ = cpp_dec_float_finite;
  local_698._4_4_ = 10;
  local_6c8._0_4_ = 0;
  local_6c8._4_4_ = 0;
  local_6c8._8_4_ = 0;
  local_6c8._12_4_ = 0;
  local_6c8._16_4_ = 0;
  local_6c8._20_4_ = 0;
  local_6c8._24_5_ = 0;
  local_6c8._29_3_ = 0;
  local_6c8._32_5_ = 0;
  local_6c8._37_3_ = 0;
  local_6c8._40_4_ = 0;
  local_6c8[0x2c] = false;
  local_690 = &this->m_rhs;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_6c8,&(this->m_rhs).m_backend,&local_5d8);
  local_688.fpclass = cpp_dec_float_finite;
  local_688.prec_elem = 10;
  local_688.data._M_elems[0] = 0;
  local_688.data._M_elems[1] = 0;
  local_688.data._M_elems[2] = 0;
  local_688.data._M_elems[3] = 0;
  local_688.data._M_elems[4] = 0;
  local_688.data._M_elems[5] = 0;
  local_688.data._M_elems._24_5_ = 0;
  local_688.data._M_elems[7]._1_3_ = 0;
  local_688.data._M_elems._32_5_ = 0;
  local_688.data._M_elems[9]._1_3_ = 0;
  local_688.exp = 0;
  local_688.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_688,&local_598,&local_5d8);
  local_618.data._M_elems[9]._1_3_ = local_6c8._37_3_;
  local_618.data._M_elems._32_5_ = local_6c8._32_5_;
  local_618.data._M_elems[7]._1_3_ = local_6c8._29_3_;
  local_618.data._M_elems._24_5_ = local_6c8._24_5_;
  local_618.data._M_elems[4] = local_6c8._16_4_;
  local_618.data._M_elems[5] = local_6c8._20_4_;
  local_618.data._M_elems[0] = local_6c8._0_4_;
  local_618.data._M_elems[1] = local_6c8._4_4_;
  local_618.data._M_elems[2] = local_6c8._8_4_;
  local_618.data._M_elems[3] = local_6c8._12_4_;
  local_618.exp = local_6c8._40_4_;
  local_618.neg = local_6c8[0x2c];
  local_618.fpclass = (fpclass_type)local_698;
  local_618.prec_elem = local_698._4_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_618,&local_688);
  uVar7 = local_618._48_8_;
  bVar10 = local_618.neg;
  iVar11 = local_618.exp;
  local_528[0] = local_618.data._M_elems[0];
  local_528[1] = local_618.data._M_elems[1];
  auStack_520[0] = local_618.data._M_elems[2];
  auStack_520[1] = local_618.data._M_elems[3];
  local_518[0] = local_618.data._M_elems[4];
  local_518[1] = local_618.data._M_elems[5];
  auStack_510[0] = local_618.data._M_elems[6];
  auStack_510[1] = local_618.data._M_elems[7];
  local_508[0] = local_618.data._M_elems[8];
  local_508[1] = local_618.data._M_elems[9];
  local_4f8 = local_618.fpclass;
  iStack_4f4 = local_618.prec_elem;
  uStack_4f0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_478,this);
  uVar8 = local_618._48_8_;
  local_6c8._32_5_ = (undefined5)local_508._0_8_;
  local_6c8._37_3_ = SUB83(local_508._0_8_,5);
  local_6c8._16_4_ = local_518[0];
  local_6c8._20_4_ = local_518[1];
  local_6c8._24_5_ = auStack_510._0_5_;
  local_6c8._29_3_ = auStack_510[1]._1_3_;
  local_6c8._0_4_ = local_528[0];
  local_6c8._4_4_ = local_528[1];
  uVar6 = local_6c8._0_8_;
  local_6c8._8_4_ = auStack_520[0];
  local_6c8._12_4_ = auStack_520[1];
  local_6c8._40_4_ = iVar11;
  local_6c8[0x2c] = bVar10;
  local_618.fpclass = (fpclass_type)uVar7;
  local_618.prec_elem = SUB84(uVar7,4);
  local_698._0_4_ = local_618.fpclass;
  local_698._4_4_ = local_618.prec_elem;
  if ((bVar10 == true) &&
     (local_6c8._0_4_ = local_528[0], local_6c8._0_4_ != 0 || local_4f8 != cpp_dec_float_finite)) {
    local_6c8[0x2c] = false;
  }
  pnVar24 = local_690;
  local_6c8._0_8_ = uVar6;
  local_618._48_8_ = uVar8;
  if (((local_4f8 != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN)) &&
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_6c8,&local_478),
     pnVar24 = local_690, iVar11 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_618,0.0);
  }
  local_688.data._M_elems._32_5_ = local_618.data._M_elems._32_5_;
  local_688.data._M_elems[9]._1_3_ = local_618.data._M_elems[9]._1_3_;
  local_688.data._M_elems[4] = local_618.data._M_elems[4];
  local_688.data._M_elems[5] = local_618.data._M_elems[5];
  local_688.data._M_elems._24_5_ = local_618.data._M_elems._24_5_;
  local_688.data._M_elems[7]._1_3_ = local_618.data._M_elems[7]._1_3_;
  local_688.data._M_elems[0] = local_618.data._M_elems[0];
  local_688.data._M_elems[1] = local_618.data._M_elems[1];
  local_688.data._M_elems[2] = local_618.data._M_elems[2];
  local_688.data._M_elems[3] = local_618.data._M_elems[3];
  local_688.exp = local_618.exp;
  local_688.neg = local_618.neg;
  local_688.fpclass = local_618.fpclass;
  local_688.prec_elem = local_618.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_688,&local_5d8);
  local_698 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0xa00000000;
  local_6c8._0_4_ = 0;
  local_6c8._4_4_ = 0;
  local_6c8._8_4_ = 0;
  local_6c8._12_4_ = 0;
  local_6c8._16_4_ = 0;
  local_6c8._20_4_ = 0;
  local_6c8._24_5_ = 0;
  local_6c8._29_3_ = 0;
  local_6c8._32_5_ = 0;
  local_6c8._37_3_ = 0;
  local_6c8._40_4_ = 0;
  local_6c8[0x2c] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_6c8,&local_688,&local_440);
  iVar11 = this->m_j;
  pnVar5 = (local_648->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
       CONCAT35(local_6c8._37_3_,local_6c8._32_5_);
  puVar2 = pnVar5[iVar11].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_6c8._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_6c8._29_3_,local_6c8._24_5_);
  *(undefined8 *)&pnVar5[iVar11].m_backend.data = local_6c8._0_8_;
  *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = local_6c8._8_8_;
  pnVar5[iVar11].m_backend.exp = local_6c8._40_4_;
  pnVar5[iVar11].m_backend.neg = local_6c8[0x2c];
  *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    **)&pnVar5[iVar11].m_backend.fpclass = local_698;
  iVar11 = this->m_i;
  pnVar5 = (local_630->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
       *(undefined8 *)((pnVar24->m_backend).data._M_elems + 8);
  uVar7 = *(undefined8 *)(pnVar24->m_backend).data._M_elems;
  uVar8 = *(undefined8 *)((pnVar24->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)((pnVar24->m_backend).data._M_elems + 6);
  puVar2 = pnVar5[iVar11].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = *(undefined8 *)((pnVar24->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar2 + 2) = uVar6;
  *(undefined8 *)&pnVar5[iVar11].m_backend.data = uVar7;
  *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = uVar8;
  pnVar5[iVar11].m_backend.exp = (this->m_rhs).m_backend.exp;
  pnVar5[iVar11].m_backend.neg = (this->m_rhs).m_backend.neg;
  iVar9 = (this->m_rhs).m_backend.prec_elem;
  pnVar5[iVar11].m_backend.fpclass = (this->m_rhs).m_backend.fpclass;
  pnVar5[iVar11].m_backend.prec_elem = iVar9;
  if (isOptimal) {
    iVar11 = this->m_j;
    pnVar5 = (local_648->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_188.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8);
    local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar11].m_backend.data;
    local_188.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar11].m_backend.data._M_elems + 4;
    local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_188.m_backend.exp = pnVar5[iVar11].m_backend.exp;
    local_188.m_backend.neg = pnVar5[iVar11].m_backend.neg;
    local_188.m_backend.fpclass = pnVar5[iVar11].m_backend.fpclass;
    local_188.m_backend.prec_elem = pnVar5[iVar11].m_backend.prec_elem;
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_lower).m_backend.data._M_elems
    ;
    local_1c8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2);
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
    local_1c8.m_backend.exp = (this->m_lower).m_backend.exp;
    local_1c8.m_backend.neg = (this->m_lower).m_backend.neg;
    local_1c8.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
    local_1c8.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_68,this);
    bVar10 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_188,&local_1c8,&local_68);
    if (!bVar10) {
      iVar11 = this->m_j;
      pnVar5 = (local_648->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_538 = *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 8);
      local_558 = pnVar5[iVar11].m_backend.data._M_elems[0];
      auStack_550 = *(uint (*) [2])(pnVar5[iVar11].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar11].m_backend.data._M_elems + 4;
      local_548 = *(uint (*) [2])puVar2;
      uStack_540 = *(undefined8 *)(puVar2 + 2);
      iVar4 = pnVar5[iVar11].m_backend.exp;
      local_630 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT71(local_630._1_7_,pnVar5[iVar11].m_backend.neg);
      local_690 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)&pnVar5[iVar11].m_backend.fpclass;
      local_208.data._M_elems._32_8_ = *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8);
      local_208.data._M_elems._0_8_ = *(undefined8 *)(this->m_upper).m_backend.data._M_elems;
      local_208.data._M_elems._8_8_ = *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2);
      local_208.data._M_elems._16_8_ = *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4);
      local_208.data._M_elems._24_8_ = *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6);
      local_208.exp = (this->m_upper).m_backend.exp;
      local_208.neg = (this->m_upper).m_backend.neg;
      local_208.fpclass = (this->m_upper).m_backend.fpclass;
      local_208.prec_elem = (this->m_upper).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_4b0,this);
      local_6c8._32_5_ = (undefined5)local_538;
      local_6c8._37_3_ = (undefined3)((ulong)local_538 >> 0x28);
      local_6c8._16_4_ = local_548[0];
      local_6c8._20_4_ = local_548[1];
      local_6c8._24_5_ = (undefined5)uStack_540;
      local_6c8._29_3_ = (undefined3)((ulong)uStack_540 >> 0x28);
      local_6c8._0_4_ = local_558[0];
      local_6c8._4_4_ = local_558[1];
      local_6c8._8_4_ = auStack_550[0];
      local_6c8._12_4_ = auStack_550[1];
      local_6c8[0x2c] = (bool)local_630._0_1_;
      local_698 = local_690;
      local_6c8._40_4_ = iVar4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)local_6c8,&local_208);
      if ((((fpclass_type)local_698 == cpp_dec_float_NaN) ||
          (local_4b0.fpclass == cpp_dec_float_NaN)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_6c8,&local_4b0), iVar11 < 1))
      goto LAB_002fc375;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"EMAISM: numerical violation after disaggregating variable",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
LAB_002fc375:
  local_698._0_4_ = cpp_dec_float_finite;
  local_698._4_4_ = 10;
  local_6c8._0_4_ = 0;
  local_6c8._4_4_ = 0;
  local_6c8._8_4_ = 0;
  local_6c8._12_4_ = 0;
  local_6c8._16_4_ = 0;
  local_6c8._20_4_ = 0;
  local_6c8._24_5_ = 0;
  local_6c8._29_3_ = 0;
  local_6c8._32_5_ = 0;
  local_6c8._37_3_ = 0;
  local_6c8._40_4_ = 0;
  local_6c8[0x2c] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_6c8,0.0);
  iVar11 = (this->m_col).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar11) {
    lVar23 = 0;
    lVar17 = 0;
    do {
      pNVar13 = (this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      iVar4 = *(int *)((long)(&pNVar13->val + 1) + lVar23);
      if (iVar4 != this->m_i) {
        pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar13->val).m_backend.data._M_elems + lVar23);
        pcVar22 = &(local_620->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend;
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems[0] = 0;
        local_688.data._M_elems[1] = 0;
        local_688.data._M_elems[2] = 0;
        local_688.data._M_elems[3] = 0;
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems._32_5_ = 0;
        local_688.data._M_elems[9]._1_3_ = 0;
        local_688.exp = 0;
        local_688.neg = false;
        v_00 = pcVar1;
        if ((&local_688 != pcVar22) && (v_00 = pcVar22, pcVar1 != &local_688)) {
          uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_688.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_688.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_688.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_688.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_688.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_688.exp = *(int *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar23);
          local_688.neg = *(bool *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar23 + 4);
          local_688._48_8_ =
               *(undefined8 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar23 + 8);
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_688,v_00);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)local_6c8,&local_688);
        iVar11 = (this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar17 = lVar17 + 1;
      lVar23 = lVar23 + 0x3c;
    } while (lVar17 < iVar11);
  }
  local_688.fpclass = cpp_dec_float_finite;
  local_688.prec_elem = 10;
  local_688.data._M_elems[0] = 0;
  local_688.data._M_elems[1] = 0;
  local_688.data._M_elems[2] = 0;
  local_688.data._M_elems[3] = 0;
  local_688.data._M_elems[4] = 0;
  local_688.data._M_elems[5] = 0;
  local_688.data._M_elems._24_5_ = 0;
  local_688.data._M_elems[7]._1_3_ = 0;
  local_688.data._M_elems._32_5_ = 0;
  local_688.data._M_elems[9]._1_3_ = 0;
  local_688.exp = 0;
  local_688.neg = false;
  if (&local_688 != &(this->m_obj).m_backend) {
    uVar6 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
    local_688.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_688.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
    local_688.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
    local_688.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
    uVar6 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
    local_688.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_688.exp = (this->m_obj).m_backend.exp;
    local_688.neg = (this->m_obj).m_backend.neg;
    local_688.fpclass = (this->m_obj).m_backend.fpclass;
    local_688.prec_elem = (this->m_obj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&local_688,(cpp_dec_float<50U,_int,_void> *)local_6c8);
  local_618.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
  local_618.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
  local_618.data._M_elems[0] = local_688.data._M_elems[0];
  local_618.data._M_elems[1] = local_688.data._M_elems[1];
  local_618.data._M_elems[2] = local_688.data._M_elems[2];
  local_618.data._M_elems[3] = local_688.data._M_elems[3];
  local_618.data._M_elems[4] = local_688.data._M_elems[4];
  local_618.data._M_elems[5] = local_688.data._M_elems[5];
  local_618.data._M_elems[9]._1_3_ = local_688.data._M_elems[9]._1_3_;
  local_618.data._M_elems._32_5_ = local_688.data._M_elems._32_5_;
  local_618.exp = local_688.exp;
  local_618.neg = local_688.neg;
  local_618.fpclass = local_688.fpclass;
  local_618.prec_elem = local_688.prec_elem;
  local_688.fpclass = cpp_dec_float_finite;
  local_688.prec_elem = 10;
  local_688.data._M_elems[0] = 0;
  local_688.data._M_elems[1] = 0;
  local_688.data._M_elems[2] = 0;
  local_688.data._M_elems[3] = 0;
  local_688.data._M_elems[4] = 0;
  local_688.data._M_elems[5] = 0;
  local_688.data._M_elems._24_5_ = 0;
  local_688.data._M_elems[7]._1_3_ = 0;
  local_688.data._M_elems._32_5_ = 0;
  local_688.data._M_elems[9]._1_3_ = 0;
  local_688.exp = 0;
  local_688.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_688,&local_618,&local_440);
  iVar11 = this->m_i;
  pnVar5 = (local_620->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar11].m_backend.data._M_elems + 8) =
       CONCAT35(local_688.data._M_elems[9]._1_3_,local_688.data._M_elems._32_5_);
  puVar2 = pnVar5[iVar11].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_688.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar11].m_backend.data = local_688.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar11].m_backend.data._M_elems + 2) = local_688.data._M_elems._8_8_;
  pnVar5[iVar11].m_backend.exp = local_688.exp;
  pnVar5[iVar11].m_backend.neg = local_688.neg;
  pnVar5[iVar11].m_backend.fpclass = local_688.fpclass;
  pnVar5[iVar11].m_backend.prec_elem = local_688.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_628->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  pVVar19 = local_648;
  pVVar14 = cStatus->data;
  VVar16 = pVVar14[iVar12];
  if ((VVar16 & ~FIXED) == ON_UPPER) {
    pnVar5 = (local_648->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_248.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    local_248.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_248.m_backend.exp = pnVar5[iVar12].m_backend.exp;
    local_248.m_backend.neg = pnVar5[iVar12].m_backend.neg;
    local_248.m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    local_248.m_backend.prec_elem = pnVar5[iVar12].m_backend.prec_elem;
    local_288.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(this->m_oldupper).m_backend.data._M_elems;
    local_288.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 2);
    local_288.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 4);
    local_288.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 6);
    local_288.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_oldupper).m_backend.data._M_elems + 8);
    local_288.m_backend.exp = (this->m_oldupper).m_backend.exp;
    local_288.m_backend.neg = (this->m_oldupper).m_backend.neg;
    local_288.m_backend.fpclass = (this->m_oldupper).m_backend.fpclass;
    local_288.m_backend.prec_elem = (this->m_oldupper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_a0,this);
    bVar10 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_248,&local_288,&local_a0);
    if (!bVar10) {
      pVVar14 = cStatus->data;
      VVar16 = pVVar14[iVar12];
      goto LAB_002fc6a5;
    }
LAB_002fc775:
    cStatus->data[iVar12] = BASIC;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((local_628->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar12),0.0);
    iVar12 = this->m_j;
    pnVar5 = (pVVar19->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_348.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    local_348.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
    local_348.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    local_348.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_348.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_348.m_backend.exp = pnVar5[iVar12].m_backend.exp;
    local_348.m_backend.neg = pnVar5[iVar12].m_backend.neg;
    local_348.m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
    local_348.m_backend.prec_elem = pnVar5[iVar12].m_backend.prec_elem;
    local_388.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8);
    local_388.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_upper).m_backend.data._M_elems
    ;
    local_388.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2);
    local_388.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4);
    local_388.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6);
    local_388.m_backend.exp = (this->m_upper).m_backend.exp;
    local_388.m_backend.neg = (this->m_upper).m_backend.neg;
    local_388.m_backend.fpclass = (this->m_upper).m_backend.fpclass;
    local_388.m_backend.prec_elem = (this->m_upper).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
    bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_348,&local_388,&local_110);
    iVar12 = this->m_j;
    if (bVar10) {
      pVVar14 = cStatus->data;
      VVar16 = ON_UPPER;
    }
    else {
      pnVar5 = (pVVar19->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
      local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
      local_3c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
      local_3c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_3c8.m_backend.exp = pnVar5[iVar12].m_backend.exp;
      local_3c8.m_backend.neg = pnVar5[iVar12].m_backend.neg;
      local_3c8.m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
      local_3c8.m_backend.prec_elem = pnVar5[iVar12].m_backend.prec_elem;
      local_408.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(this->m_lower).m_backend.data._M_elems;
      local_408.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2);
      local_408.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4);
      local_408.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6);
      local_408.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
      local_408.m_backend.exp = (this->m_lower).m_backend.exp;
      local_408.m_backend.neg = (this->m_lower).m_backend.neg;
      local_408.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
      local_408.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_148,this);
      bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_3c8,&local_408,&local_148);
      if (!bVar10) {
        ::soplex::infinity::__tls_init();
        local_648 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)(in_FS_OFFSET + -8);
        local_688.fpclass = cpp_dec_float_finite;
        local_688.prec_elem = 10;
        local_688.data._M_elems[0] = 0;
        local_688.data._M_elems[1] = 0;
        local_688.data._M_elems[2] = 0;
        local_688.data._M_elems[3] = 0;
        local_688.data._M_elems[4] = 0;
        local_688.data._M_elems[5] = 0;
        local_688.data._M_elems._24_5_ = 0;
        local_688.data._M_elems[7]._1_3_ = 0;
        local_688.data._M_elems._32_5_ = 0;
        local_688.data._M_elems[9]._1_3_ = 0;
        local_688.exp = 0;
        local_688.neg = false;
        uStack_640 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_648);
        if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_688.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&(this->m_upper).m_backend,&local_688), -1 < iVar12)) {
          ::soplex::infinity::__tls_init();
          local_4e8.fpclass = cpp_dec_float_finite;
          local_4e8.prec_elem = 10;
          local_4e8.data._M_elems[0] = 0;
          local_4e8.data._M_elems[1] = 0;
          local_4e8.data._M_elems[2] = 0;
          local_4e8.data._M_elems[3] = 0;
          local_4e8.data._M_elems[4] = 0;
          local_4e8.data._M_elems[5] = 0;
          local_4e8.data._M_elems._24_5_ = 0;
          local_4e8.data._M_elems[7]._1_3_ = 0;
          local_4e8.data._M_elems._32_5_ = 0;
          local_4e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_4e8,-(double)local_648);
          if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_4e8.fpclass != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&(this->m_lower).m_backend,&local_4e8), iVar12 < 1)) {
            iVar12 = this->m_j;
            pVVar14 = cStatus->data;
            VVar16 = ZERO;
            goto LAB_002fc932;
          }
        }
        puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_688.data._M_elems._0_8_ = local_688.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_688,
                   "XMAISM unexpected basis status in aggregation unsimplifier.","");
        *puVar15 = &PTR__SPxException_0069d438;
        puVar15[1] = puVar15 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar15 + 1),local_688.data._M_elems._0_8_,
                   local_688.data._M_elems._0_8_ + local_688.data._M_elems._8_8_);
        *puVar15 = &PTR__SPxException_0069d410;
        __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar12 = this->m_j;
      pVVar14 = cStatus->data;
      VVar16 = ON_LOWER;
    }
  }
  else {
LAB_002fc6a5:
    pVVar19 = local_648;
    if (VVar16 - ON_LOWER < 2) {
      pnVar5 = (local_648->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
      local_2c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar12].m_backend.data;
      local_2c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
      puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
      local_2c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_2c8.m_backend.exp = pnVar5[iVar12].m_backend.exp;
      local_2c8.m_backend.neg = pnVar5[iVar12].m_backend.neg;
      local_2c8.m_backend.fpclass = pnVar5[iVar12].m_backend.fpclass;
      local_2c8.m_backend.prec_elem = pnVar5[iVar12].m_backend.prec_elem;
      local_308.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(this->m_oldlower).m_backend.data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 2);
      local_308.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 4);
      local_308.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 6);
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_oldlower).m_backend.data._M_elems + 8);
      local_308.m_backend.exp = (this->m_oldlower).m_backend.exp;
      local_308.m_backend.neg = (this->m_oldlower).m_backend.neg;
      local_308.m_backend.fpclass = (this->m_oldlower).m_backend.fpclass;
      local_308.m_backend.prec_elem = (this->m_oldlower).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_d8,this);
      bVar10 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_2c8,&local_308,&local_d8);
      if (bVar10) goto LAB_002fc775;
      pVVar14 = cStatus->data;
    }
    iVar12 = this->m_j;
    VVar16 = BASIC;
  }
LAB_002fc932:
  pVVar14[iVar12] = VVar16;
  rStatus->data[this->m_i] = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}